

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_standard_midi.cpp
# Opt level: O0

bool midi_processor::is_standard_midi(vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
  if ((((sVar1 < 0x12) ||
       (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,0),
       *pvVar2 != 'M')) ||
      (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,1),
      *pvVar2 != 'T')) ||
     ((pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,2),
      *pvVar2 != 'h' ||
      (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,3),
      *pvVar2 != 'd')))) {
    return false;
  }
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
  if (((*pvVar2 == '\0') &&
      ((pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5),
       *pvVar2 == '\0' &&
       (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,6),
       *pvVar2 == '\0')))) &&
     (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,7),
     *pvVar2 == '\x06')) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,10);
    if ((*pvVar2 == '\0') &&
       (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,0xb),
       *pvVar2 == '\0')) {
      return false;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,0xc);
    if ((*pvVar2 == '\0') &&
       (pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,0xd),
       *pvVar2 == '\0')) {
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

bool midi_processor::is_standard_midi( std::vector<uint8_t> const& p_file )
{
    if ( p_file.size() < 18 ) return false;
    if ( p_file[ 0 ] != 'M' || p_file[ 1 ] != 'T' || p_file[ 2 ] != 'h' || p_file[ 3 ] != 'd') return false;
    if ( p_file[ 4 ] != 0 || p_file[ 5 ] != 0 || p_file[ 6 ] != 0 || p_file[ 7 ] != 6 ) return false;
    if ( p_file[ 10 ] == 0 && p_file[ 11 ] == 0 ) return false; // no tracks
    if ( p_file[ 12 ] == 0 && p_file[ 13 ] == 0 ) return false; // dtx == 0, will cause division by zero on tempo calculations
    return true;
}